

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::destroyAll(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
             *this)

{
  bool bVar1;
  uint uVar2;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar3;
  KeyID *pKVar4;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *E;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *P;
  KeyID TombstoneKey;
  KeyID EmptyKey;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *this_local;
  
  uVar2 = getNumBuckets(this);
  if (uVar2 != 0) {
    TombstoneKey = getEmptyKey();
    P = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)getTombstoneKey();
    E = getBuckets(this);
    pDVar3 = getBucketsEnd(this);
    for (; E != pDVar3; E = E + 1) {
      pKVar4 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
      bVar1 = DenseMapInfo<llbuild::core::KeyID>::isEqual(pKVar4,&TombstoneKey);
      if (!bVar1) {
        pKVar4 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
        bVar1 = DenseMapInfo<llbuild::core::KeyID>::isEqual(pKVar4,(KeyID *)&P);
        if (!bVar1) {
          detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getSecond(E);
        }
      }
      detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
    }
  }
  return;
}

Assistant:

void destroyAll() {
    if (getNumBuckets() == 0) // Nothing to do.
      return;

    const KeyT EmptyKey = getEmptyKey(), TombstoneKey = getTombstoneKey();
    for (BucketT *P = getBuckets(), *E = getBucketsEnd(); P != E; ++P) {
      if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(P->getFirst(), TombstoneKey))
        P->getSecond().~ValueT();
      P->getFirst().~KeyT();
    }
  }